

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O0

bool write_file(string *name,string *content,bool *append)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  _Ios_Openmode __a;
  bool bVar3;
  ostream local_228 [8];
  ofstream outfile;
  bool *append_local;
  string *content_local;
  string *name_local;
  
  std::ofstream::ofstream(local_228);
  if ((*append & 1U) == 0) {
    _Var2 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)local_228,_Var2);
  }
  else {
    _Var2 = std::__cxx11::string::c_str();
    __a = std::operator|(_S_bin,_S_ate);
    std::operator|(__a,_S_app);
    std::ofstream::open((char *)local_228,_Var2);
  }
  bVar1 = std::ofstream::is_open();
  bVar3 = (bVar1 & 1) != 0;
  if (bVar3) {
    std::operator<<(local_228,(string *)content);
  }
  std::ofstream::~ofstream(local_228);
  return bVar3;
}

Assistant:

bool write_file(
        const std::string &name, const std::string &content, const bool &append) {
    std::ofstream outfile;

    if (append)
        outfile.open(
                name.c_str(),
                std::ofstream::binary|
                std::ofstream::ate|
                std::ofstream::app
            );
    else
        outfile.open(name.c_str(), std::ofstream::binary);

    if (outfile.is_open()) {
        outfile << content;
        return true;
    }

    return false;
}